

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O1

void __thiscall
sigslot::_signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>::slot_duplicate
          (_signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local> *this,
          has_slots<sigslot::multi_threaded_local> *oldtarget,
          has_slots<sigslot::multi_threaded_local> *newtarget)

{
  size_t *psVar1;
  has_slots<sigslot::multi_threaded_local> *phVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  for (p_Var5 = (this->m_connected_slots).
                super__List_base<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var5 != (_List_node_base *)&this->m_connected_slots; p_Var5 = p_Var5->_M_next) {
    phVar2 = (has_slots<sigslot::multi_threaded_local> *)
             (**(code **)((long)(p_Var5[1]._M_next)->_M_next + 0x10))();
    if (phVar2 == oldtarget) {
      p_Var3 = (_List_node_base *)
               (**(code **)((long)(p_Var5[1]._M_next)->_M_next + 0x28))(p_Var5[1]._M_next,newtarget)
      ;
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = p_Var3;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->m_connected_slots).
                super__List_base<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[3])(this);
  return;
}

Assistant:

void slot_duplicate(const has_slots<mt_policy>* oldtarget, has_slots<mt_policy>* newtarget)
		{
			lock_block<mt_policy> lock(this);
			iterator it = m_connected_slots.begin();
			iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				if((*it)->getdest() == oldtarget)
				{
					m_connected_slots.push_back((*it)->duplicate(newtarget));
				}

				++it;
			}
		}